

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterIntel.c
# Opt level: O0

ZyanStatus
ZydisFormatterIntelPrintMnemonic
          (ZydisFormatter *formatter,ZydisFormatterBuffer *buffer,ZydisFormatterContext *context)

{
  ZydisBranchType ZVar1;
  ZydisShortString *source;
  ZyanStatus status_047620348_3;
  ZyanStatus status_047620348_2;
  ZyanStatus status_047620348_1;
  ZyanStatus status_047620348;
  ZydisShortString *mnemonic;
  ZydisFormatterContext *context_local;
  ZydisFormatterBuffer *buffer_local;
  ZydisFormatter *formatter_local;
  
  if (formatter == (ZydisFormatter *)0x0) {
    __assert_fail("formatter",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterIntel.c"
                  ,0x10d,
                  "ZyanStatus ZydisFormatterIntelPrintMnemonic(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (buffer != (ZydisFormatterBuffer *)0x0) {
    if (context != (ZydisFormatterContext *)0x0) {
      source = ZydisMnemonicGetStringWrapped(context->instruction->mnemonic);
      if (source == (ZydisShortString *)0x0) {
        if (buffer->is_token_list == '\0') {
          formatter_local._4_4_ =
               ZydisStringAppendShortCase
                         (&buffer->string,&STR_INVALID_MNEMONIC,formatter->case_mnemonic);
        }
        else {
          formatter_local._4_4_ =
               ZydisFormatterBufferAppendPredefined
                         (buffer,(ZydisPredefinedToken *)&TOK_DATA_INVALID_MNEMONIC);
        }
        if ((formatter_local._4_4_ & 0x80000000) == 0) {
          formatter_local._4_4_ = 0x100000;
        }
      }
      else if (((buffer->is_token_list == '\0') ||
               (formatter_local._4_4_ = ZydisFormatterBufferAppend(buffer,'\x06'),
               (formatter_local._4_4_ & 0x80000000) == 0)) &&
              (formatter_local._4_4_ =
                    ZydisStringAppendShortCase(&buffer->string,source,formatter->case_mnemonic),
              (formatter_local._4_4_ & 0x80000000) == 0)) {
        if ((context->instruction->meta).branch_type == ZYDIS_BRANCH_TYPE_FAR) {
          formatter_local._4_4_ =
               ZydisStringAppendShortCase(&buffer->string,&STR_FAR,formatter->case_mnemonic);
        }
        else if ((formatter->print_branch_size == '\0') ||
                (ZVar1 = (context->instruction->meta).branch_type, ZVar1 == ZYDIS_BRANCH_TYPE_NONE))
        {
          formatter_local._4_4_ = 0x100000;
        }
        else if (ZVar1 == ZYDIS_BRANCH_TYPE_SHORT) {
          formatter_local._4_4_ =
               ZydisStringAppendShortCase(&buffer->string,&STR_SHORT,formatter->case_mnemonic);
        }
        else if (ZVar1 == ZYDIS_BRANCH_TYPE_NEAR) {
          formatter_local._4_4_ =
               ZydisStringAppendShortCase(&buffer->string,&STR_NEAR,formatter->case_mnemonic);
        }
        else {
          formatter_local._4_4_ = 0x80100004;
        }
      }
      return formatter_local._4_4_;
    }
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterIntel.c"
                  ,0x10f,
                  "ZyanStatus ZydisFormatterIntelPrintMnemonic(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  __assert_fail("buffer",
                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterIntel.c"
                ,0x10e,
                "ZyanStatus ZydisFormatterIntelPrintMnemonic(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
               );
}

Assistant:

ZyanStatus ZydisFormatterIntelPrintMnemonic(const ZydisFormatter* formatter,
    ZydisFormatterBuffer* buffer, ZydisFormatterContext* context)
{
    ZYAN_ASSERT(formatter);
    ZYAN_ASSERT(buffer);
    ZYAN_ASSERT(context);

    const ZydisShortString* mnemonic = ZydisMnemonicGetStringWrapped(
        context->instruction->mnemonic);
    if (!mnemonic)
    {
        ZYDIS_BUFFER_APPEND_CASE(buffer, INVALID_MNEMONIC, formatter->case_mnemonic);
        return ZYAN_STATUS_SUCCESS;
    }

    ZYDIS_BUFFER_APPEND_TOKEN(buffer, ZYDIS_TOKEN_MNEMONIC);
    ZYAN_CHECK(ZydisStringAppendShortCase(&buffer->string, mnemonic, formatter->case_mnemonic));
    if (context->instruction->meta.branch_type == ZYDIS_BRANCH_TYPE_FAR)
    {
        return ZydisStringAppendShortCase(&buffer->string, &STR_FAR, formatter->case_mnemonic);
    }
    if (formatter->print_branch_size)
    {
        switch (context->instruction->meta.branch_type)
        {
        case ZYDIS_BRANCH_TYPE_NONE:
            break;
        case ZYDIS_BRANCH_TYPE_SHORT:
            return ZydisStringAppendShortCase(&buffer->string, &STR_SHORT,
                formatter->case_mnemonic);
        case ZYDIS_BRANCH_TYPE_NEAR:
            return ZydisStringAppendShortCase(&buffer->string, &STR_NEAR,
                formatter->case_mnemonic);
        default:
            return ZYAN_STATUS_INVALID_ARGUMENT;
        }
    }

    return ZYAN_STATUS_SUCCESS;
}